

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O1

bool __thiscall ON_SectionStyle::IsValid(ON_SectionStyle *this,ON_TextLog *text_log)

{
  ON_SectionStylePrivate *pOVar1;
  bool bVar2;
  ON_SectionStylePrivate *pOVar3;
  char *format;
  
  bVar2 = ON_ModelComponent::IsValid(&this->super_ON_ModelComponent,text_log);
  if (bVar2) {
    pOVar1 = this->m_private;
    pOVar3 = pOVar1;
    if (pOVar1 == (ON_SectionStylePrivate *)0x0) {
      pOVar3 = &DefaultSectionStylePrivate;
    }
    if (pOVar3->m_boundary_width_scale <= 0.0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_SectionStyle::BoundaryWidthScale <= 0\n";
    }
    else {
      pOVar3 = &DefaultSectionStylePrivate;
      if (pOVar1 != (ON_SectionStylePrivate *)0x0) {
        pOVar3 = pOVar1;
      }
      if (0.0 < pOVar3->m_hatch_scale) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_SectionStyle::SectionHatchScale <= 0\n";
    }
    ON_TextLog::Print(text_log,format);
  }
  return false;
}

Assistant:

bool ON_SectionStyle::IsValid( ON_TextLog* text_log ) const
{
  if (false == ON_ModelComponent::IsValid(text_log))
    return false;

  // An ON_SectionStyle with an empty name is valid.
  if (BoundaryWidthScale() <= 0)
  {
    if ( text_log )
      text_log->Print("ON_SectionStyle::BoundaryWidthScale <= 0\n");
    return false;
  }

  if (HatchScale() <= 0)
  {
    if (text_log)
      text_log->Print("ON_SectionStyle::SectionHatchScale <= 0\n");
    return false;
  }

  return true;
}